

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.h
# Opt level: O0

void __thiscall hwnet::http::HttpSession::~HttpSession(HttpSession *this)

{
  HttpSession *this_local;
  
  std::function<void_(std::shared_ptr<hwnet::http::HttpResponse>_&)>::~function(&this->onResponse);
  std::
  function<void_(std::shared_ptr<hwnet::http::HttpRequest>_&,_std::shared_ptr<hwnet::http::HttpResponse>_&)>
  ::~function(&this->onRequest);
  std::shared_ptr<hwnet::http::HttpPacket>::~shared_ptr(&this->packet);
  std::shared_ptr<hwnet::Buffer>::~shared_ptr(&this->recvbuff);
  std::shared_ptr<hwnet::TCPSocket>::~shared_ptr(&this->s);
  std::enable_shared_from_this<hwnet::http::HttpSession>::~enable_shared_from_this
            (&this->super_enable_shared_from_this<hwnet::http::HttpSession>);
  return;
}

Assistant:

~HttpSession(){		
	}